

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

int32_t icu_63::calcNameSetLength
                  (uint16_t *tokens,uint16_t tokenCount,uint8_t *tokenStrings,int8_t *tokenLengths,
                  uint32_t *set,uint8_t **pLine,uint8_t *lineLimit)

{
  int iVar1;
  bool bVar2;
  ushort local_4c;
  ushort local_4a;
  int local_48;
  uint16_t token;
  uint16_t c;
  int32_t tokenLength;
  int32_t length;
  uint8_t *line;
  uint8_t **pLine_local;
  uint32_t *set_local;
  int8_t *tokenLengths_local;
  uint8_t *tokenStrings_local;
  uint16_t tokenCount_local;
  uint16_t *tokens_local;
  
  _tokenLength = *pLine;
  _token = 0;
  while( true ) {
    bVar2 = false;
    if (_tokenLength != lineLimit) {
      local_4a = (ushort)*_tokenLength;
      bVar2 = local_4a != 0x3b;
      _tokenLength = _tokenLength + 1;
    }
    if (!bVar2) break;
    if (local_4a < tokenCount) {
      local_4c = tokens[local_4a];
      if (local_4c == 0xfffe) {
        local_4a = local_4a << 8 | (ushort)*_tokenLength;
        local_4c = tokens[local_4a];
        _tokenLength = _tokenLength + 1;
      }
      if (local_4c == 0xffff) {
        iVar1 = (int)(uint)(byte)local_4a >> 5;
        set[iVar1] = 1 << ((byte)local_4a & 0x1f) | set[iVar1];
        _token = _token + 1;
      }
      else {
        if (tokenLengths == (int8_t *)0x0) {
          local_48 = calcStringSetLength(set,(char *)(tokenStrings + (int)(uint)local_4c));
        }
        else {
          local_48 = (int)tokenLengths[local_4a];
          if (local_48 == 0) {
            local_48 = calcStringSetLength(set,(char *)(tokenStrings + (int)(uint)local_4c));
            tokenLengths[local_4a] = (int8_t)local_48;
          }
        }
        _token = local_48 + _token;
      }
    }
    else {
      iVar1 = (int)(uint)(byte)local_4a >> 5;
      set[iVar1] = 1 << ((byte)local_4a & 0x1f) | set[iVar1];
      _token = _token + 1;
    }
  }
  *pLine = _tokenLength;
  return _token;
}

Assistant:

static int32_t
calcNameSetLength(const uint16_t *tokens, uint16_t tokenCount, const uint8_t *tokenStrings, int8_t *tokenLengths,
                  uint32_t set[8],
                  const uint8_t **pLine, const uint8_t *lineLimit) {
    const uint8_t *line=*pLine;
    int32_t length=0, tokenLength;
    uint16_t c, token;

    while(line!=lineLimit && (c=*line++)!=(uint8_t)';') {
        if(c>=tokenCount) {
            /* implicit letter */
            SET_ADD(set, c);
            ++length;
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                c=c<<8|*line++;
                token=tokens[c];
            }
            if(token==(uint16_t)(-1)) {
                /* explicit letter */
                SET_ADD(set, c);
                ++length;
            } else {
                /* count token word */
                if(tokenLengths!=NULL) {
                    /* use cached token length */
                    tokenLength=tokenLengths[c];
                    if(tokenLength==0) {
                        tokenLength=calcStringSetLength(set, (const char *)tokenStrings+token);
                        tokenLengths[c]=(int8_t)tokenLength;
                    }
                } else {
                    tokenLength=calcStringSetLength(set, (const char *)tokenStrings+token);
                }
                length+=tokenLength;
            }
        }
    }

    *pLine=line;
    return length;
}